

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_6176c::AssertHexFloatEquals(uint32_t expected_bits,char *s)

{
  bool bVar1;
  size_t sVar2;
  Message *pMVar3;
  char *pcVar4;
  AssertHelper local_70;
  Message local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  Message local_40;
  Result local_38;
  Enum local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  char *pcStack_18;
  uint32_t actual_bits;
  char *s_local;
  uint32_t expected_bits_local;
  
  local_34 = Ok;
  pcStack_18 = s;
  s_local._4_4_ = expected_bits;
  sVar2 = strlen(s);
  local_38 = wabt::ParseFloat(Hexfloat,s,s + sVar2,(uint32_t *)((long)&gtest_ar.message_.ptr_ + 4));
  testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
            ((EqHelper<false> *)local_30,"Result::Ok",
             "ParseFloat(LiteralType::Hexfloat, s, s + strlen(s), &actual_bits)",&local_34,&local_38
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pMVar3 = testing::Message::operator<<(&local_40,&stack0xffffffffffffffe8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
               ,0xa1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(&local_40);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_60,"expected_bits","actual_bits",
               (uint *)((long)&s_local + 4),(uint *)((long)&gtest_ar.message_.ptr_ + 4));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
    if (!bVar1) {
      testing::Message::Message(&local_68);
      pMVar3 = testing::Message::operator<<(&local_68,&stack0xffffffffffffffe8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-literal.cc"
                 ,0xa3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::Message::~Message(&local_68);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  }
  return;
}

Assistant:

void AssertHexFloatEquals(uint32_t expected_bits, const char* s) {
  uint32_t actual_bits;
  ASSERT_EQ(Result::Ok,
            ParseFloat(LiteralType::Hexfloat, s, s + strlen(s), &actual_bits))
      << s;
  ASSERT_EQ(expected_bits, actual_bits) << s;
}